

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp,stbi_uc *two_back
                             )

{
  stbi_uc *psVar1;
  uint uVar2;
  uint uVar3;
  stbi_uc sVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  stbi_uc *__s;
  stbi_uc *__s_00;
  stbi_uc *psVar14;
  uint uVar15;
  undefined4 in_register_0000000c;
  ulong uVar16;
  char *pcVar17;
  int iVar18;
  uint uVar19;
  uint n;
  uint uVar20;
  uint uVar21;
  byte bVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  size_t __size;
  uint uVar26;
  size_t __size_00;
  stbi_uc (*pal) [4];
  long in_FS_OFFSET;
  
  psVar1 = g->out;
  if (psVar1 == (stbi_uc *)0x0) {
    iVar8 = stbi__gif_header(s,g,comp,0);
    if (iVar8 == 0) {
      return (stbi_uc *)0x0;
    }
    iVar8 = g->w;
    iVar9 = g->h;
    iVar10 = stbi__mad3sizes_valid(4,iVar8,iVar9,0);
    if (iVar10 == 0) {
      pcVar17 = "too large";
      goto LAB_0015ff63;
    }
    iVar9 = iVar9 * iVar8;
    __size = (size_t)(iVar9 * 4);
    __s = (stbi_uc *)malloc(__size);
    g->out = __s;
    __s_00 = (stbi_uc *)malloc(__size);
    __size_00 = (size_t)iVar9;
    g->background = __s_00;
    psVar14 = (stbi_uc *)malloc(__size_00);
    pcVar17 = "outofmem";
    g->history = psVar14;
    if ((__s == (stbi_uc *)0x0) || (psVar14 == (stbi_uc *)0x0 || __s_00 == (stbi_uc *)0x0))
    goto LAB_0015ff63;
    memset(__s,0,__size);
    memset(__s_00,0,__size);
    memset(psVar14,0,__size_00);
  }
  else {
    uVar20 = (uint)g->eflags >> 2 & 7;
    uVar7 = g->h * g->w;
    uVar24 = uVar20;
    if (uVar20 == 3) {
      uVar24 = 2;
    }
    if (CONCAT44(in_register_0000000c,req_comp) != 0) {
      uVar24 = uVar20;
    }
    if (uVar24 == 3) {
      for (uVar16 = 0; (~((int)uVar7 >> 0x1f) & uVar7) != uVar16; uVar16 = uVar16 + 1) {
        if (g->history[uVar16] != '\0') {
          *(undefined4 *)(g->out + uVar16 * 4) =
               *(undefined4 *)(CONCAT44(in_register_0000000c,req_comp) + uVar16 * 4);
        }
      }
    }
    else if (uVar24 == 2) {
      for (uVar16 = 0; (~((int)uVar7 >> 0x1f) & uVar7) != uVar16; uVar16 = uVar16 + 1) {
        if (g->history[uVar16] != '\0') {
          *(undefined4 *)(g->out + uVar16 * 4) = *(undefined4 *)(g->background + uVar16 * 4);
        }
      }
    }
    memcpy(g->background,g->out,(long)g->h * (long)g->w * 4);
    psVar14 = g->history;
    __size_00 = (long)g->h * (long)g->w;
  }
  memset(psVar14,0,__size_00);
  pal = g->pal;
  while (sVar4 = stbi__get8(s), sVar4 == '!') {
    sVar4 = stbi__get8(s);
    if (sVar4 == 0xf9) {
      bVar5 = stbi__get8(s);
      if (bVar5 == 4) {
        bVar5 = stbi__get8(s);
        g->eflags = (uint)bVar5;
        iVar8 = stbi__get16le(s);
        g->delay = iVar8 * 10;
        if (-1 < (long)g->transparent) {
          g->pal[g->transparent][3] = 0xff;
        }
        if ((g->eflags & 1) == 0) {
          stbi__skip(s,1);
          g->transparent = -1;
        }
        else {
          bVar5 = stbi__get8(s);
          g->transparent = (uint)bVar5;
          g->pal[bVar5][3] = '\0';
        }
        goto LAB_0015fe3e;
      }
      stbi__skip(s,(uint)bVar5);
    }
    else {
LAB_0015fe3e:
      while (bVar5 = stbi__get8(s), bVar5 != 0) {
        stbi__skip(s,(uint)bVar5);
      }
    }
  }
  if (sVar4 == ';') {
    return (stbi_uc *)s;
  }
  if (sVar4 == ',') {
    iVar8 = stbi__get16le(s);
    iVar9 = stbi__get16le(s);
    iVar10 = stbi__get16le(s);
    iVar11 = stbi__get16le(s);
    pcVar17 = "bad Image Descriptor";
    if ((iVar10 + iVar8 <= g->w) && (iVar11 + iVar9 <= g->h)) {
      iVar18 = g->w * 4;
      g->line_size = iVar18;
      iVar11 = iVar18 * (iVar11 + iVar9);
      g->start_x = iVar8 << 2;
      g->start_y = iVar9 * iVar18;
      g->max_x = (iVar10 + iVar8) * 4;
      g->max_y = iVar11;
      if (iVar10 != 0) {
        iVar11 = iVar9 * iVar18;
      }
      g->cur_x = iVar8 << 2;
      g->cur_y = iVar11;
      bVar5 = stbi__get8(s);
      g->lflags = (uint)bVar5;
      iVar8 = g->line_size * 8;
      if ((bVar5 & 0x40) == 0) {
        iVar8 = g->line_size;
      }
      g->step = iVar8;
      g->parse = (int)((uint)bVar5 << 0x19) >> 0x1f & 3;
      if ((char)bVar5 < '\0') {
        pal = g->lpal;
        if ((g->eflags & 1) == 0) {
          iVar8 = -1;
        }
        else {
          iVar8 = g->transparent;
        }
        stbi__gif_parse_colortable(s,pal,2 << (bVar5 & 7),iVar8);
      }
      else if ((g->flags & 0x80) == 0) {
        pcVar17 = "missing color table";
        goto LAB_0015ff63;
      }
      g->color_table = *pal;
      bVar5 = stbi__get8(s);
      if (0xc < bVar5) {
        return (stbi_uc *)0x0;
      }
      uVar24 = 1 << (bVar5 & 0x1f);
      for (uVar16 = 0; uVar24 != uVar16; uVar16 = uVar16 + 1) {
        g->codes[uVar16].prefix = -1;
        g->codes[uVar16].first = (stbi_uc)uVar16;
        g->codes[uVar16].suffix = (stbi_uc)uVar16;
      }
      uVar12 = (2 << (bVar5 & 0x1f)) - 1;
      n = 0;
      uVar26 = 0;
      uVar7 = 0;
      bVar6 = 0;
      uVar2 = 0xffffffff;
      uVar3 = uVar24 + 2;
      uVar20 = bVar5 + 1;
      uVar23 = uVar12;
      do {
        while (uVar13 = uVar23, uVar15 = uVar20, uVar19 = uVar3, uVar21 = uVar2, bVar22 = bVar6,
              uVar20 = uVar26 - uVar15, (int)uVar15 <= (int)uVar26) {
          uVar23 = (int)uVar7 >> (uVar15 & 0x1f);
          uVar25 = uVar7 & uVar13;
          uVar26 = uVar20;
          uVar7 = uVar23;
          bVar6 = 1;
          uVar2 = 0xffffffff;
          uVar3 = uVar24 + 2;
          uVar20 = bVar5 + 1;
          uVar23 = uVar12;
          if (uVar25 != uVar24) {
            if (uVar25 == uVar24 + 1) goto LAB_0016019e;
            pcVar17 = "no clear code";
            if ((int)uVar19 < (int)uVar25) {
              pcVar17 = "illegal code in raster";
              goto LAB_0015ff63;
            }
            if ((bool)(bVar22 ^ 1)) goto LAB_0015ff63;
            if ((int)uVar21 < 0) {
              if (uVar25 == uVar19) {
                pcVar17 = "illegal code in raster";
                goto LAB_0015ff63;
              }
            }
            else {
              if (0x1fff < (int)uVar19) {
                pcVar17 = "too many codes";
                goto LAB_0015ff63;
              }
              g->codes[(int)uVar19].prefix = (stbi__int16)uVar21;
              sVar4 = g->codes[uVar21].first;
              g->codes[(int)uVar19].first = sVar4;
              if (uVar25 != uVar19 + 1) {
                sVar4 = g->codes[(int)uVar25].first;
              }
              g->codes[(int)uVar19].suffix = sVar4;
              uVar19 = uVar19 + 1;
            }
            stbi__out_gif_code(g,(stbi__uint16)uVar25);
            uVar20 = uVar15 + 1;
            uVar23 = ~(-1 << (uVar20 & 0x1f));
            if (0xfff < (int)uVar19 || (uVar19 & uVar13) != 0) {
              uVar23 = uVar13;
              uVar20 = uVar15;
            }
            bVar6 = 1;
            uVar2 = uVar25;
            uVar3 = uVar19;
          }
        }
        if (n == 0) {
          bVar6 = stbi__get8(s);
          if (bVar6 == 0) goto LAB_001601b7;
          n = (uint)bVar6;
        }
        n = n - 1;
        bVar6 = stbi__get8(s);
        uVar20 = uVar26 & 0x1f;
        uVar26 = uVar26 + 8;
        uVar7 = uVar7 | (uint)bVar6 << uVar20;
        bVar6 = bVar22;
        uVar2 = uVar21;
        uVar3 = uVar19;
        uVar20 = uVar15;
        uVar23 = uVar13;
      } while( true );
    }
  }
  else {
    pcVar17 = "unknown code";
  }
LAB_0015ff63:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar17;
  return (stbi_uc *)0x0;
LAB_0016019e:
  do {
    stbi__skip(s,n);
    bVar5 = stbi__get8(s);
    n = (uint)bVar5;
  } while (bVar5 != 0);
LAB_001601b7:
  psVar14 = g->out;
  if (psVar14 == (stbi_uc *)0x0) {
    return (stbi_uc *)0x0;
  }
  if (psVar1 == (stbi_uc *)0x0) {
    if (0 < g->bgindex) {
      uVar24 = g->h * g->w;
      for (uVar16 = 0; (~((int)uVar24 >> 0x1f) & uVar24) != uVar16; uVar16 = uVar16 + 1) {
        if (g->history[uVar16] == '\0') {
          g->pal[g->bgindex][3] = 0xff;
          *(stbi_uc (*) [4])(g->out + uVar16 * 4) = g->pal[g->bgindex];
        }
      }
      return psVar14;
    }
    return psVar14;
  }
  return psVar14;
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp, stbi_uc *two_back)
{
   int dispose;
   int first_frame;
   int pi;
   int pcount;
   STBI_NOTUSED(req_comp);

   // on first frame, any non-written pixels get the background colour (non-transparent)
   first_frame = 0;
   if (g->out == 0) {
      if (!stbi__gif_header(s, g, comp,0)) return 0; // stbi__g_failure_reason set by stbi__gif_header
      if (!stbi__mad3sizes_valid(4, g->w, g->h, 0))
         return stbi__errpuc("too large", "GIF image is too large");
      pcount = g->w * g->h;
      g->out = (stbi_uc *) stbi__malloc(4 * pcount);
      g->background = (stbi_uc *) stbi__malloc(4 * pcount);
      g->history = (stbi_uc *) stbi__malloc(pcount);
      if (!g->out || !g->background || !g->history)
         return stbi__errpuc("outofmem", "Out of memory");

      // image is treated as "transparent" at the start - ie, nothing overwrites the current background;
      // background colour is only used for pixels that are not rendered first frame, after that "background"
      // color refers to the color that was there the previous frame.
      memset(g->out, 0x00, 4 * pcount);
      memset(g->background, 0x00, 4 * pcount); // state of the background (starts transparent)
      memset(g->history, 0x00, pcount);        // pixels that were affected previous frame
      first_frame = 1;
   } else {
      // second frame - how do we dispoase of the previous one?
      dispose = (g->eflags & 0x1C) >> 2;
      pcount = g->w * g->h;

      if ((dispose == 3) && (two_back == 0)) {
         dispose = 2; // if I don't have an image to revert back to, default to the old background
      }

      if (dispose == 3) { // use previous graphic
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &two_back[pi * 4], 4 );
            }
         }
      } else if (dispose == 2) {
         // restore what was changed last frame to background before that frame;
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &g->background[pi * 4], 4 );
            }
         }
      } else {
         // This is a non-disposal case eithe way, so just
         // leave the pixels as is, and they will become the new background
         // 1: do not dispose
         // 0:  not specified.
      }

      // background is what out is after the undoing of the previou frame;
      memcpy( g->background, g->out, 4 * g->w * g->h );
   }

   // clear my history;
   memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame

   for (;;) {
      int tag = stbi__get8(s);
      switch (tag) {
         case 0x2C: /* Image Descriptor */
         {
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            // if the width of the specified rectangle is 0, that means
            // we may not see *any* pixels or the image is malformed;
            // to make sure this is caught, move the current y down to
            // max_y (which is what out_gif_code checks).
            if (w == 0)
               g->cur_y = g->max_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");

            o = stbi__process_gif_raster(s, g);
            if (!o) return NULL;

            // if this was the first frame,
            pcount = g->w * g->h;
            if (first_frame && (g->bgindex > 0)) {
               // if first frame, any pixel not drawn to gets the background color
               for (pi = 0; pi < pcount; ++pi) {
                  if (g->history[pi] == 0) {
                     g->pal[g->bgindex][3] = 255; // just in case it was made transparent, undo that; It will be reset next frame if need be;
                     memcpy( &g->out[pi * 4], &g->pal[g->bgindex], 4 );
                  }
               }
            }

            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            int ext = stbi__get8(s);
            if (ext == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  g->delay = 10 * stbi__get16le(s); // delay - 1/100th of a second, saving as 1/1000ths.

                  // unset old transparent
                  if (g->transparent >= 0) {
                     g->pal[g->transparent][3] = 255;
                  }
                  if (g->eflags & 0x01) {
                     g->transparent = stbi__get8(s);
                     if (g->transparent >= 0) {
                        g->pal[g->transparent][3] = 0;
                     }
                  } else {
                     // don't need transparent
                     stbi__skip(s, 1);
                     g->transparent = -1;
                  }
               } else {
                  stbi__skip(s, len);
                  break;
               }
            }
            while ((len = stbi__get8(s)) != 0) {
               stbi__skip(s, len);
            }
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }
}